

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

url_mapper * __thiscall
cppcms::url_mapper::data::child(data *this,string_key *name,string_key *full_url)

{
  entry *peVar1;
  url_mapper *puVar2;
  cppcms_error *this_00;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  peVar1 = get_entry(this,name,1,full_url);
  if (peVar1->child != (application *)0x0) {
    puVar2 = application::mapper(peVar1->child);
    return puVar2;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  string_key::str_abi_cxx11_(&local_c0,name);
  std::operator+(&local_a0,"url_mapper: the key ",&local_c0);
  std::operator+(&local_80,&local_a0," is not child application key in url `");
  string_key::str_abi_cxx11_(&local_e0,full_url);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,"\'");
  cppcms_error::cppcms_error(this_00,&local_40);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

url_mapper &child(string_key const &name,string_key const &full_url)
		{
			entry const &fmt = get_entry(name,1,full_url);
			if(!fmt.child) {
				throw cppcms_error("url_mapper: the key " + name.str() + " is not child application key"
						" in url `" + full_url.str() + "'");
			}
			return fmt.child->mapper();
		}